

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O1

bool __thiscall CMDPSTATE::AddPred(CMDPSTATE *this,int stateID)

{
  int *piVar1;
  iterator __position;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int local_4;
  
  piVar1 = (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  bVar5 = 0 < (int)uVar3;
  if (0 < (int)uVar3) {
    if (*piVar1 == stateID) {
      return true;
    }
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      if ((uVar3 & 0x7fffffff) == uVar4) break;
      uVar2 = uVar4 + 1;
    } while (piVar1[uVar4] != stateID);
    bVar5 = uVar4 < (uVar3 & 0x7fffffff);
  }
  if (!bVar5) {
    __position._M_current =
         (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->PredsID,__position,&local_4);
    }
    else {
      *__position._M_current = stateID;
      (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  return true;
}

Assistant:

bool CMDPSTATE::AddPred(int stateID)
{
    //add the predecessor
    if (!ContainsPred(stateID)) {
#if MEM_CHECK
        DisableMemCheck();
#endif

        PredsID.push_back(stateID);
#if MEM_CHECK
        EnableMemCheck();
#endif
    }

    return true;
}